

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O1

void init_default_stack_impl(void)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  
  init_default_stack_impl_inner();
  pbVar2 = (byte *)getenv("TCMALLOC_STACKTRACE_METHOD_VERBOSE");
  if (pbVar2 != (byte *)0x0) {
    bVar1 = *pbVar2;
    if ((((bVar1 - 0x54 < 0x26) && ((0x2100000021U >> ((ulong)(bVar1 - 0x54) & 0x3f) & 1) != 0)) ||
        (bVar1 == 0x31)) || (bVar1 == 0)) {
      fprintf(_stderr,"Chosen stacktrace method is %s\nSupported methods:\n",get_stack_impl->name);
      lVar3 = 0;
      do {
        fprintf(_stderr,"* %s\n",*(undefined8 *)(*(long *)((long)all_impls + lVar3) + 0x20));
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      fputs("\nUse TCMALLOC_STACKTRACE_METHOD environment variable to override\n",_stderr);
      return;
    }
  }
  return;
}

Assistant:

ATTRIBUTE_NOINLINE
static void init_default_stack_impl(void) {
  init_default_stack_impl_inner();
  if (EnvToBool("TCMALLOC_STACKTRACE_METHOD_VERBOSE", false)) {
    fprintf(stderr, "Chosen stacktrace method is %s\nSupported methods:\n", get_stack_impl->name);
    for (int i = 0; i < sizeof(all_impls) / sizeof(all_impls[0]); i++) {
      GetStackImplementation *c = all_impls[i];
      fprintf(stderr, "* %s\n", c->name);
    }
    fputs("\nUse TCMALLOC_STACKTRACE_METHOD environment variable to override\n", stderr);
  }
}